

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumlib.hpp
# Opt level: O1

double __thiscall sumlib::rsorted<double>::get(rsorted<double> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  
  pdVar1 = (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    uVar6 = (long)pdVar2 - (long)pdVar1 >> 3;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar1,pdVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar1,pdVar2);
  }
  pdVar7 = (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar8 = pdVar3 + -1;
  pdVar5 = pdVar7;
  if (pdVar7 < pdVar8 && pdVar7 != pdVar3) {
    do {
      pdVar9 = pdVar5 + 1;
      dVar10 = *pdVar5;
      *pdVar5 = *pdVar8;
      *pdVar8 = dVar10;
      pdVar8 = pdVar8 + -1;
      pdVar5 = pdVar9;
    } while (pdVar9 < pdVar8);
  }
  dVar10 = 0.0;
  for (; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
    dVar10 = dVar10 + *pdVar7;
  }
  return dVar10;
}

Assistant:

T get() {
            std::sort( begin(xs), end(xs) );
            std::reverse( begin(xs), end(xs) );
            return accumulate(begin(xs), end(xs), (T)0);
        }